

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string1.cpp
# Opt level: O0

void __thiscall String::String(String *this,char *str)

{
  ostream *this_00;
  char *pcVar1;
  size_t sVar2;
  int length;
  char *str_local;
  String *this_local;
  
  this_00 = std::operator<<((ostream *)&std::cout,"String constructor!");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  if (str == (char *)0x0) {
    pcVar1 = (char *)operator_new__(1);
    this->m_data = pcVar1;
    *this->m_data = '\0';
    this->m_size = 0;
  }
  else {
    sVar2 = strlen(str);
    pcVar1 = (char *)operator_new__((long)((int)sVar2 + 1));
    this->m_data = pcVar1;
    strcpy(this->m_data,str);
    this->m_size = (long)(int)sVar2;
  }
  return;
}

Assistant:

String::String(const char* str)
{
	cout << "String constructor!" << endl;
	if (str == nullptr) {
		m_data = new char[1];
		*m_data = '\0';
		m_size = 0;

	} else {
		int length = strlen(str);
		m_data = new char[length + 1];
		strcpy(m_data, str);
		m_size = length;
	}
}